

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyCleanWord2000(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  Lexer *lexer;
  Bool BVar2;
  int iVar3;
  TidyTagId TVar4;
  Node *node_00;
  AttVal *pAVar5;
  Node *node_01;
  AttVal *pAVar6;
  ctmbstr ptVar7;
  Dict *pDVar8;
  Node *pNVar9;
  TidyTagId tid;
  bool bVar10;
  Node *next;
  Node *local_50;
  uint local_44;
  Lexer *local_40;
  Node *local_38;
  
  if (node == (Node *)0x0) {
    return;
  }
  local_40 = doc->lexer;
  local_50 = (Node *)0x0;
  do {
    if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_HTML)) {
      BVar2 = prvTidyIsWord2000(doc);
      if (BVar2 == no) {
        return;
      }
      pAVar5 = node->attributes;
      while (pAVar6 = pAVar5, pAVar6 != (AttVal *)0x0) {
        pAVar5 = pAVar6->next;
        if ((pAVar6->attribute == (char *)0x0) ||
           (iVar3 = strcmp(pAVar6->attribute,"xmlns"), iVar3 != 0)) {
          prvTidyReportAttrError(doc,node,pAVar6,0x26f);
        }
      }
      prvTidyFreeAttrs(doc,node);
    }
    node_01 = node;
    if (((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_P)) &&
       (BVar2 = NoMargins(node), BVar2 != no)) {
      prvTidyCoerceNode(doc,node,TidyTag_PRE,no,yes);
      PurgeWord2000Attributes(doc,node);
      if (node->content != (Node *)0x0) {
        prvTidyCleanWord2000(doc,node->content);
      }
      node_01 = node->next;
      bVar10 = node_01 == (Node *)0x0;
      if (bVar10) {
        return;
      }
      pDVar8 = node_01->tag;
      while (((pDVar8 != (Dict *)0x0 && (pDVar8->id == TidyTag_P)) &&
             (BVar2 = NoMargins(node_01), BVar2 != no))) {
        pNVar9 = node_01->next;
        prvTidyRemoveNode(node_01);
        node_00 = prvTidyNewLineNode(local_40);
        prvTidyInsertNodeAtEnd(node,node_00);
        prvTidyInsertNodeAtEnd(node,node_01);
        StripSpan(doc,node_01);
        bVar10 = pNVar9 == (Node *)0x0;
        if (bVar10) {
          return;
        }
        pDVar8 = pNVar9->tag;
        node_01 = pNVar9;
      }
      if (bVar10) {
        return;
      }
    }
    if (((node_01->tag != (Dict *)0x0) && ((node_01->tag->model & 8) != 0)) &&
       ((pNVar9 = node_01->content, pNVar9 != (Node *)0x0 &&
        ((pNVar9->next == (Node *)0x0 && (pNVar9->type == TextNode)))))) {
      uVar1 = pNVar9->start;
      iVar3 = pNVar9->end - uVar1;
      if (iVar3 == 2) {
        local_44 = 0;
        prvTidyGetUTF8(local_40->lexbuf + uVar1,&local_44);
        if (local_44 != 0xa0) goto LAB_0014b56f;
      }
      else if ((iVar3 != 1) || (local_40->lexbuf[uVar1] != ' ')) goto LAB_0014b56f;
      goto LAB_0014b5c2;
    }
LAB_0014b56f:
    pDVar8 = node_01->tag;
    if (((pDVar8 == (Dict *)0x0) ||
        ((pDVar8->id != TidyTag_STYLE && ((pDVar8 == (Dict *)0x0 || (pDVar8->id != TidyTag_META)))))
        ) && (node_01->type != CommentTag)) {
      pDVar8 = node_01->tag;
      if (pDVar8 != (Dict *)0x0) {
        if (pDVar8->id == TidyTag_SPAN) {
LAB_0014b5c2:
          node = StripSpan(doc,node_01);
          goto LAB_0014b59c;
        }
        if (pDVar8 != (Dict *)0x0) {
          if (pDVar8->id == TidyTag_FONT) goto LAB_0014b5c2;
          if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == TidyTag_LINK)) {
            pAVar5 = prvTidyAttrGetById(node_01,TidyAttr_REL);
            bVar10 = true;
            if ((pAVar5 != (AttVal *)0x0) &&
               ((pAVar5->value != (ctmbstr)0x0 &&
                (iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"File-List"), iVar3 == 0)))) {
              node_01 = prvTidyDiscardElement(doc,node_01);
              bVar10 = false;
            }
            node = node_01;
            if (!bVar10) goto LAB_0014b59c;
          }
        }
      }
      if ((node_01->tag == (Dict *)0x0) ||
         (iVar3 = prvTidytmbstrcmp(node_01->tag->name,"o:p"), iVar3 != 0)) {
        if ((node_01 == (Node *)0x0) ||
           (((node_01->content != (Node *)0x0 || (node_01->tag == (Dict *)0x0)) ||
            (node_01->tag->id != TidyTag_P)))) {
          if (((node_01 == (Node *)0x0) || (node_01->tag == (Dict *)0x0)) ||
             (node_01->tag->id != TidyTag_P)) {
LAB_0014b7a6:
            local_50 = (Node *)0x0;
          }
          else {
            pAVar5 = prvTidyAttrGetById(node_01,TidyAttr_CLASS);
            pAVar6 = prvTidyAttrGetById(node_01,TidyAttr_STYLE);
            if (((pAVar5 == (AttVal *)0x0) ||
                (((pAVar5->value == (ctmbstr)0x0 ||
                  (iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"MsoListBullet"), iVar3 != 0)) &&
                 ((pAVar5->value == (ctmbstr)0x0 ||
                  (iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"MsoListNumber"), iVar3 != 0)))))) &&
               (((pAVar6 == (AttVal *)0x0 || (pAVar6->value == (ctmbstr)0x0)) ||
                (ptVar7 = prvTidytmbsubstr(pAVar6->value,"mso-list:"), ptVar7 == (ctmbstr)0x0)))) {
              if (((pAVar5 == (AttVal *)0x0) || (pAVar5->value == (ctmbstr)0x0)) ||
                 (iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"Code"), lexer = local_40, iVar3 != 0))
              goto LAB_0014b7a6;
              pNVar9 = prvTidyNewLineNode(local_40);
              prvTidyNormalizeSpaces(lexer,node_01->content);
              if (((local_50 == (Node *)0x0) || (local_50->tag == (Dict *)0x0)) ||
                 (local_50->tag->id != TidyTag_PRE)) {
                local_50 = prvTidyInferredTag(doc,TidyTag_PRE);
                prvTidyInsertNodeBeforeElement(node_01,local_50);
              }
              prvTidyRemoveNode(node_01);
              prvTidyInsertNodeAtEnd(local_50,node_01);
              StripSpan(doc,node_01);
              prvTidyInsertNodeAtEnd(local_50,pNVar9);
              node_01 = local_50->next;
            }
            else {
              tid = TidyTag_UL;
              if ((pAVar5 != (AttVal *)0x0) && (pAVar5->value != (ctmbstr)0x0)) {
                iVar3 = prvTidytmbstrcasecmp(pAVar5->value,"MsoListNumber");
                tid = TidyTag_UL;
                if (iVar3 == 0) {
                  tid = TidyTag_OL;
                }
              }
              prvTidyCoerceNode(doc,node_01,TidyTag_LI,no,yes);
              if (local_50 == (Node *)0x0) {
LAB_0014b7ef:
                pDVar8 = prvTidyLookupTagDef(tid);
                local_50 = prvTidyInferredTag(doc,pDVar8->id);
                prvTidyInsertNodeBeforeElement(node_01,local_50);
              }
              else {
                if (local_50->tag == (Dict *)0x0) {
                  TVar4 = TidyTag_UNKNOWN;
                }
                else {
                  TVar4 = local_50->tag->id;
                }
                if (TVar4 != tid) goto LAB_0014b7ef;
              }
              PurgeWord2000Attributes(doc,node_01);
              if (node_01->content != (Node *)0x0) {
                prvTidyCleanWord2000(doc,node_01->content);
              }
              prvTidyRemoveNode(node_01);
              prvTidyInsertNodeAtEnd(local_50,node_01);
              node_01 = local_50;
            }
          }
          if (node_01 == (Node *)0x0) {
            return;
          }
          BVar2 = prvTidynodeIsElement(node_01);
          if (BVar2 != no) {
            PurgeWord2000Attributes(doc,node_01);
          }
          if (node_01->content != (Node *)0x0) {
            prvTidyCleanWord2000(doc,node_01->content);
          }
          node = node_01->next;
        }
        else {
          node = prvTidyTrimEmptyElement(doc,node_01);
        }
      }
      else {
        prvTidyReport(doc,(Node *)0x0,node_01,0x270);
        DiscardContainer(doc,node_01,&local_38);
        node = local_38;
      }
    }
    else {
      node = prvTidyDiscardElement(doc,node_01);
    }
LAB_0014b59c:
    if (node == (Node *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void TY_(CleanWord2000)( TidyDocImpl* doc, Node *node)
{
    /* used to a list from a sequence of bulleted p's */
    Lexer* lexer = doc->lexer;
    Node* list = NULL;
    AttVal *next_attr, *attval;

    while ( node )
    {
        /* get rid of Word's xmlns attributes */
        if ( nodeIsHTML(node) )
        {
            /* check that it's a Word 2000 document */
            if ( !TY_(IsWord2000) (doc) ) /* Is. #896 */
                return;

            /* Output proprietary attributes to maintain errout compatibility
             * with traditional Tidy. This is a result of moving all of the
             * proprietary checks to near the end of the cleanup process,
             * meaning this result would not ordinarily be displayed. 
             */
            attval = node->attributes;
            while ( attval ) {
                next_attr = attval->next;

                /* Issue #591 - take care of a NULL attribute, too. */
                if ( !attval->attribute || ( strcmp(attval->attribute, "xmlns") != 0 ))
                    TY_(ReportAttrError)(doc, node, attval, PROPRIETARY_ATTRIBUTE);
                attval = next_attr;
            }

            TY_(FreeAttrs)( doc, node );
        }

        /* fix up preformatted sections by looking for a
        ** sequence of paragraphs with zero top/bottom margin
        */
        if ( nodeIsP(node) )
        {
            if (NoMargins(node))
            {
                Node *pre, *next;
                TY_(CoerceNode)(doc, node, TidyTag_PRE, no, yes);

                PurgeWord2000Attributes( doc, node );

                if (node->content)
                    TY_(CleanWord2000)( doc, node->content );

                pre = node;
                node = node->next;

                /* continue to strip p's */

                while ( nodeIsP(node) && NoMargins(node) )
                {
                    next = node->next;
                    TY_(RemoveNode)(node);
                    TY_(InsertNodeAtEnd)(pre, TY_(NewLineNode)(lexer));
                    TY_(InsertNodeAtEnd)(pre, node);
                    StripSpan( doc, node );
                    node = next;
                }

                if (node == NULL)
                    break;
            }
        }

        if (node->tag && (node->tag->model & CM_BLOCK)
            && SingleSpace(lexer, node))
        {
            node = StripSpan( doc, node );
            continue;
        }
        /* discard Word's style verbiage */
        if ( nodeIsSTYLE(node) || nodeIsMETA(node) ||
             node->type == CommentTag )
        {
            node = TY_(DiscardElement)( doc, node );
            continue;
        }

        /* strip out all span and font tags Word scatters so liberally! */
        if ( nodeIsSPAN(node) || nodeIsFONT(node) )
        {
            node = StripSpan( doc, node );
            continue;
        }

        if ( nodeIsLINK(node) )
        {
            AttVal *attr = TY_(AttrGetById)(node, TidyAttr_REL);

            if (AttrValueIs(attr, "File-List"))
            {
                node = TY_(DiscardElement)( doc, node );
                continue;
            }
        }

        /* discards <o:p> which encodes the paragraph mark */
        if ( node->tag && TY_(tmbstrcmp)(node->tag->name,"o:p")==0)
        {
            /* Output proprietary elements to maintain errout compatibility
             * with traditional Tidy. This is a result of moving all of the
             * proprietary checks to near the end of the cleanup process,
             * meaning this result would not ordinarily be displayed.
             */
            Node* next;
            TY_(Report)(doc, NULL, node, PROPRIETARY_ELEMENT);
            DiscardContainer( doc, node, &next );
            node = next;
            continue;
        }

        /* discard empty paragraphs */

        if ( node->content == NULL && nodeIsP(node) )
        {
            /*  Use the existing function to ensure consistency */
            Node *next = TY_(TrimEmptyElement)( doc, node );
            node = next;
            continue;
        }

        if ( nodeIsP(node) )
        {
            AttVal *attr, *atrStyle;
            
            attr = TY_(AttrGetById)(node, TidyAttr_CLASS);
            atrStyle = TY_(AttrGetById)(node, TidyAttr_STYLE);
            /*
               (JES) Sometimes Word marks a list item with the following hokie syntax
               <p class="MsoNormal" style="...;mso-list:l1 level1 lfo1;
                translate these into <li>
            */
            /* map sequence of <p class="MsoListBullet"> to <ul>...</ul> */
            /* map <p class="MsoListNumber"> to <ol>...</ol> */
            if ( AttrValueIs(attr, "MsoListBullet") ||
                 AttrValueIs(attr, "MsoListNumber") ||
                 AttrContains(atrStyle, "mso-list:") )
            {
                TidyTagId listType = TidyTag_UL;
                if (AttrValueIs(attr, "MsoListNumber"))
                    listType = TidyTag_OL;

                TY_(CoerceNode)(doc, node, TidyTag_LI, no, yes);

                if ( !list || TagId(list) != listType )
                {
                    const Dict* tag = TY_(LookupTagDef)( listType );
                    list = TY_(InferredTag)(doc, tag->id);
                    TY_(InsertNodeBeforeElement)(node, list);
                }

                PurgeWord2000Attributes( doc, node );

                if ( node->content )
                    TY_(CleanWord2000)( doc, node->content );

                /* remove node and append to contents of list */
                TY_(RemoveNode)(node);
                TY_(InsertNodeAtEnd)(list, node);
                node = list;
            }
            /* map sequence of <p class="Code"> to <pre>...</pre> */
            else if (AttrValueIs(attr, "Code"))
            {
                Node *br = TY_(NewLineNode)(lexer);
                TY_(NormalizeSpaces)(lexer, node->content);

                if ( !list || TagId(list) != TidyTag_PRE )
                {
                    list = TY_(InferredTag)(doc, TidyTag_PRE);
                    TY_(InsertNodeBeforeElement)(node, list);
                }

                /* remove node and append to contents of list */
                TY_(RemoveNode)(node);
                TY_(InsertNodeAtEnd)(list, node);
                StripSpan( doc, node );
                TY_(InsertNodeAtEnd)(list, br);
                node = list->next;
            }
            else
                list = NULL;
        }
        else
            list = NULL;

        if (!node)
            return;

        /* strip out style and class attributes */
        if (TY_(nodeIsElement)(node))
            PurgeWord2000Attributes( doc, node );

        if (node->content)
            TY_(CleanWord2000)( doc, node->content );

        node = node->next;
    }
}